

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PArena.cpp
# Opt level: O1

bool __thiscall amrex::PArena::isDevice(PArena *this)

{
  return false;
}

Assistant:

bool
PArena::isDevice () const
{
#ifdef AMREX_USE_GPU
#ifdef AMREX_CUDA_GE_11_2
    if (Gpu::Device::memoryPoolsSupported()) {
        return true; // cudaMallocAsync allocates device memory
    } else
#endif
    {
        return The_Arena()->isDevice();
    }
#else
    return false;
#endif
}